

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::STA_ZP_X(CPU *this)

{
  byte bVar1;
  
  this->cycles = 4;
  bVar1 = GetByte(this);
  WriteByte(this,(ushort)this->X + (ushort)bVar1,this->A);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::STA_ZP_X()
{
    cycles = 4;
    WriteByte(GetByte() + X, A);
    cycles--;
}